

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void upb_Message_Freeze(upb_Message *msg,upb_MiniTable *m)

{
  upb_MiniTableField *f;
  byte bVar1;
  upb_MiniTableField *puVar2;
  upb_MiniTableExtension *f_00;
  upb_Array *arr;
  upb_Map *map;
  _Bool _Var3;
  upb_CType uVar4;
  upb_MiniTable *puVar5;
  upb_Extension *puVar6;
  upb_Message **ppuVar7;
  upb_Map **ppuVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint *puVar12;
  upb_Message *local_48;
  upb_Map *ret;
  long local_38;
  
  if (((msg->field_0).internal_opaque & 1) == 0) {
    (msg->field_0).internal_opaque = (msg->field_0).internal_opaque | 1;
    local_38 = (ulong)m->field_count_dont_copy_me__upb_internal_use_only * 0xc;
    for (lVar9 = 0; local_38 != lVar9; lVar9 = lVar9 + 0xc) {
      puVar2 = m->fields_dont_copy_me__upb_internal_use_only;
      f = (upb_MiniTableField *)((long)&puVar2->number_dont_copy_me__upb_internal_use_only + lVar9);
      puVar5 = upb_MiniTable_SubMessage(m,f);
      switch((&puVar2->mode_dont_copy_me__upb_internal_use_only)[lVar9] & 3) {
      case 0:
        _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(f);
        _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(f);
        ret = (upb_Map *)0x0;
        if ((f->mode_dont_copy_me__upb_internal_use_only & 8) != 0) {
LAB_002535ab:
          __assert_fail("!upb_MiniTableField_IsExtension(field)",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                        ,0x10d,
                        "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                       );
        }
        if (((-1 < *(short *)((long)&puVar2->presence + lVar9)) &&
            (_Var3 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(f,&ret),
            _Var3)) || (_Var3 = upb_Message_HasBaseField(msg,f), _Var3)) {
          ppuVar8 = (upb_Map **)
                    ((long)&msg->field_0 +
                    (ulong)*(ushort *)
                            ((long)&puVar2->offset_dont_copy_me__upb_internal_use_only + lVar9));
        }
        else {
          ppuVar8 = &ret;
        }
        _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&local_48,ppuVar8);
        if (((ulong)local_48 & 1) != 0) {
          __assert_fail("!upb_TaggedMessagePtr_IsEmpty(tagged)",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                        ,0x1ac,
                        "void _upb_Message_AssertMapIsUntagged_dont_copy_me__upb_internal_use_only(const struct upb_Message *, const upb_MiniTableField *)"
                       );
        }
        local_48 = (upb_Message *)0x0;
        if ((f->mode_dont_copy_me__upb_internal_use_only & 8) != 0) goto LAB_002535ab;
        if (((-1 < *(short *)((long)&puVar2->presence + lVar9)) &&
            (_Var3 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(f,&local_48)
            , _Var3)) || (_Var3 = upb_Message_HasBaseField(msg,f), ppuVar7 = &local_48, _Var3)) {
          ppuVar7 = (upb_Message **)
                    ((long)&msg->field_0 +
                    (ulong)*(ushort *)
                            ((long)&puVar2->offset_dont_copy_me__upb_internal_use_only + lVar9));
        }
        _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&ret,ppuVar7);
        map = ret;
        if (ret != (upb_Map *)0x0) {
          if (puVar5->field_count_dont_copy_me__upb_internal_use_only != 2) {
            __assert_fail("upb_MiniTable_FieldCount(m) == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                          ,0xa5,
                          "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                         );
          }
          if (puVar5->fields_dont_copy_me__upb_internal_use_only[1].
              number_dont_copy_me__upb_internal_use_only != 2) {
            __assert_fail("upb_MiniTableField_Number(f) == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                          ,0xa7,
                          "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                         );
          }
          puVar5 = upb_MiniTable_SubMessage
                             (puVar5,puVar5->fields_dont_copy_me__upb_internal_use_only + 1);
          upb_Map_Freeze(map,puVar5);
        }
        break;
      case 1:
        _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(f);
        _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(f);
        local_48 = (upb_Message *)0x0;
        if ((f->mode_dont_copy_me__upb_internal_use_only & 8) != 0) goto LAB_002535ab;
        if (((-1 < *(short *)((long)&puVar2->presence + lVar9)) &&
            (_Var3 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(f,&local_48)
            , _Var3)) || (_Var3 = upb_Message_HasBaseField(msg,f), ppuVar7 = &local_48, _Var3)) {
          ppuVar7 = (upb_Message **)
                    ((long)&msg->field_0 +
                    (ulong)*(ushort *)
                            ((long)&puVar2->offset_dont_copy_me__upb_internal_use_only + lVar9));
        }
        _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&ret,ppuVar7);
        if (ret != (upb_Map *)0x0) {
          upb_Array_Freeze((upb_Array *)ret,puVar5);
        }
        break;
      case 2:
        if (puVar5 != (upb_MiniTable *)0x0) {
          ret = (upb_Map *)0x0;
          uVar4 = upb_MiniTableField_CType(f);
          if (uVar4 != kUpb_CType_Message) {
            __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                          ,0x1bd,
                          "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                         );
          }
          bVar1 = f->mode_dont_copy_me__upb_internal_use_only;
          if (bVar1 < 0xc0) {
            __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                          ,0x1bf,
                          "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                         );
          }
          if ((bVar1 & 3) != 2) {
            __assert_fail("upb_MiniTableField_IsScalar(f)",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                          ,0x1c0,
                          "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                         );
          }
          if ((bVar1 & 8) != 0) goto LAB_002535ab;
          if (((-1 < *(short *)((long)&puVar2->presence + lVar9)) &&
              (_Var3 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(f,&ret),
              _Var3)) || (_Var3 = upb_Message_HasBaseField(msg,f), _Var3)) {
            ppuVar8 = (upb_Map **)
                      ((long)&msg->field_0 +
                      (ulong)*(ushort *)
                              ((long)&puVar2->offset_dont_copy_me__upb_internal_use_only + lVar9));
          }
          else {
            ppuVar8 = &ret;
          }
          _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&local_48,ppuVar8);
          if (((ulong)local_48 & 1) != 0) {
            __assert_fail("!upb_TaggedMessagePtr_IsEmpty(ptr)",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/tagged_ptr.h"
                          ,0x28,
                          "struct upb_Message *upb_TaggedMessagePtr_GetNonEmptyMessage(uintptr_t)");
          }
          if (local_48 != (upb_Message *)0x0) {
            upb_Message_Freeze(local_48,puVar5);
          }
        }
      }
    }
    puVar12 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
    if (puVar12 == (uint *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (ulong)*puVar12;
    }
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      if ((*(uintptr_t *)(puVar12 + uVar11 * 2 + 2) & 1) != 0) {
        puVar6 = upb_TaggedAuxPtr_Extension
                           ((upb_TaggedAuxPtr)*(uintptr_t *)(puVar12 + uVar11 * 2 + 2));
        f_00 = puVar6->ext;
        uVar4 = upb_MiniTableField_CType(&f_00->field_dont_copy_me__upb_internal_use_only);
        if (uVar4 == kUpb_CType_Message) {
          puVar5 = (f_00->sub_dont_copy_me__upb_internal_use_only).
                   submsg_dont_copy_me__upb_internal_use_only;
        }
        else {
          puVar5 = (upb_MiniTable *)0x0;
        }
        arr = (puVar6->data).array_val;
        switch((f_00->field_dont_copy_me__upb_internal_use_only).
               mode_dont_copy_me__upb_internal_use_only & 3) {
        case 0:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                        ,0x131,"void upb_Message_Freeze(upb_Message *, const upb_MiniTable *)");
        case 1:
          if (arr != (upb_Array *)0x0) {
            upb_Array_Freeze(arr,puVar5);
          }
          break;
        case 2:
          if (arr != (upb_Array *)0x0 &&
              ((f_00->field_dont_copy_me__upb_internal_use_only).
               descriptortype_dont_copy_me__upb_internal_use_only & 0xfe) == 10) {
            upb_Message_Freeze((upb_Message *)arr,puVar5);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void upb_Message_Freeze(upb_Message* msg, const upb_MiniTable* m) {
  if (upb_Message_IsFrozen(msg)) return;
  UPB_PRIVATE(_upb_Message_ShallowFreeze)(msg);

  // Base Fields.
  const size_t field_count = upb_MiniTable_FieldCount(m);

  for (size_t i = 0; i < field_count; i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    const upb_MiniTable* m2 = upb_MiniTable_SubMessage(m, f);

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = upb_Message_GetMutableArray(msg, f);
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map: {
        upb_Map* map = upb_Message_GetMutableMap(msg, f);
        if (map) {
          const upb_MiniTableField* f2 = upb_MiniTable_MapValue(m2);
          const upb_MiniTable* m3 = upb_MiniTable_SubMessage(m2, f2);
          upb_Map_Freeze(map, m3);
        }
        break;
      }
      case kUpb_FieldMode_Scalar: {
        if (m2) {
          upb_Message* msg2 = upb_Message_GetMutableMessage(msg, f);
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
      }
    }
  }

  // Extensions.
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  // TODO: b/376969853 - use iterator API
  uint32_t size = in ? in->size : 0;
  for (size_t i = 0; i < size; i++) {
    upb_TaggedAuxPtr tagged_ptr = in->aux_data[i];
    if (!upb_TaggedAuxPtr_IsExtension(tagged_ptr)) {
      continue;
    }
    const upb_Extension* ext = upb_TaggedAuxPtr_Extension(tagged_ptr);
    const upb_MiniTableExtension* e = ext->ext;
    const upb_MiniTableField* f = &e->UPB_PRIVATE(field);
    const upb_MiniTable* m2 = upb_MiniTableExtension_GetSubMessage(e);

    upb_MessageValue val;
    memcpy(&val, &(ext->data), sizeof(upb_MessageValue));

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = (upb_Array*)val.array_val;
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map:
        UPB_UNREACHABLE();  // Maps cannot be extensions.
        break;
      case kUpb_FieldMode_Scalar:
        if (upb_MiniTableField_IsSubMessage(f)) {
          upb_Message* msg2 = (upb_Message*)val.msg_val;
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
    }
  }
}